

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCacheCommand.cxx
# Opt level: O2

bool cmLoadCacheCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  string *prefix;
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmMakefile *pcVar2;
  bool bVar3;
  bool bVar4;
  cmake *pcVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *arg;
  pointer pbVar9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar10;
  string line;
  undefined1 *local_12b0 [2];
  undefined1 local_12a0 [16];
  string cacheFile;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variablesToRead;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  excludes;
  
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar9 == pbVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&excludes,"called with wrong number of arguments.",
               (allocator<char> *)&includes);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else if (((ulong)((long)pbVar1 - (long)pbVar9) < 0x21) ||
          (bVar3 = std::operator==(pbVar9 + 1,"READ_WITH_PREFIX"), !bVar3)) {
    pcVar5 = cmMakefile::GetCMakeInstance(status->Makefile);
    if (pcVar5->CurrentWorkingMode != SCRIPT_MODE) {
      excludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &excludes._M_t._M_impl.super__Rb_tree_header._M_header;
      excludes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      excludes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      excludes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = false;
      excludes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           excludes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (pbVar9 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar1;
          pbVar9 = pbVar9 + 1) {
        if (bVar3) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&excludes,pbVar9);
        }
        bVar4 = std::operator==(pbVar9,"EXCLUDE");
        if (bVar4) {
          bVar3 = true;
        }
        if ((bVar3) && (bVar4 = std::operator==(pbVar9,"INCLUDE_INTERNALS"), bVar4)) break;
      }
      includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &includes._M_t._M_impl.super__Rb_tree_header._M_header;
      includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      includes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      includes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = false;
      includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           includes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (pbVar9 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar1;
          pbVar9 = pbVar9 + 1) {
        if (bVar3) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&includes,pbVar9);
        }
        bVar4 = std::operator==(pbVar9,"INCLUDE_INTERNALS");
        if (bVar4) {
          bVar3 = true;
        }
        if ((bVar3) && (bVar4 = std::operator==(pbVar9,"EXCLUDE"), bVar4)) break;
      }
      pcVar2 = status->Makefile;
      pbVar9 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      while (((pbVar9 != pbVar1 && (bVar3 = std::operator==(pbVar9,"EXCLUDE"), !bVar3)) &&
             (bVar3 = std::operator==(pbVar9,"INCLUDE_INTERNALS"), !bVar3))) {
        pcVar5 = cmMakefile::GetCMakeInstance(pcVar2);
        cmake::LoadCache(pcVar5,pbVar9,false,&excludes,&includes);
        pbVar9 = pbVar9 + 1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&includes._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&excludes._M_t);
      return true;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&excludes,"Only load_cache(READ_WITH_PREFIX) may be used in script mode",
               (allocator<char> *)&includes);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    __lhs = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    if (0x40 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs)) {
      std::operator+(&cacheFile,__lhs,"/CMakeCache.txt");
      bVar3 = cmsys::SystemTools::FileExists(&cacheFile);
      if (bVar3) {
        pbVar9 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::
        set<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&variablesToRead,pbVar9 + 3,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        std::ifstream::ifstream(&includes,cacheFile._M_dataplus._M_p,_S_in);
        pcVar2 = status->Makefile;
        line._M_dataplus._M_p = (pointer)&line.field_2;
        line._M_string_length = 0;
        prefix = pbVar9 + 2;
        line.field_2._M_local_buf[0] = '\0';
        while ((*(byte *)((long)&includes._M_t._M_impl.super__Rb_tree_header._M_header._M_right +
                         *(long *)(includes._M_t._M_impl._0_8_ + -0x18)) & 5) == 0) {
          std::istream::read((char *)&includes,(long)&excludes);
          if (CONCAT44(includes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                       includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color) != 0) {
            psVar6 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(&excludes._M_t._M_impl.field_0x0 +
                        CONCAT44(includes._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                                 includes._M_t._M_impl.super__Rb_tree_header._M_header._M_color));
            psVar7 = &excludes;
            while (psVar8 = psVar7, psVar7 != psVar6) {
              for (; (psVar10 = psVar6, psVar8 != psVar6 &&
                     (psVar10 = psVar8, *(char *)&(psVar8->_M_t)._M_impl != '\n'));
                  psVar8 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&(psVar8->_M_t)._M_impl.field_0x1) {
              }
              if ((psVar10 == psVar7) ||
                 (*(char *)((long)&psVar10[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
                  != '\r')) {
                local_12b0[0] = local_12a0;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_12b0,psVar7,psVar10)
                ;
                std::__cxx11::string::append((string *)&line);
              }
              else {
                local_12b0[0] = local_12a0;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_12b0,psVar7,
                           (undefined1 *)
                           ((long)&psVar10[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
                          );
                std::__cxx11::string::append((string *)&line);
              }
              std::__cxx11::string::~string((string *)local_12b0);
              psVar7 = psVar10;
              if (psVar8 != psVar6) {
                CheckLine(pcVar2,prefix,&variablesToRead,line._M_dataplus._M_p);
                line._M_string_length = 0;
                *line._M_dataplus._M_p = '\0';
                psVar7 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&(psVar10->_M_t)._M_impl.field_0x1;
              }
            }
          }
        }
        if (line._M_string_length != 0) {
          CheckLine(pcVar2,prefix,&variablesToRead,line._M_dataplus._M_p);
        }
        std::__cxx11::string::~string((string *)&line);
        std::ifstream::~ifstream(&includes);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&variablesToRead._M_t);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &excludes,"Cannot load cache file from ",&cacheFile);
        std::__cxx11::string::_M_assign((string *)&status->Error);
        std::__cxx11::string::~string((string *)&excludes);
      }
      std::__cxx11::string::~string((string *)&cacheFile);
      return bVar3;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&excludes,"READ_WITH_PREFIX form must specify a prefix.",
               (allocator<char> *)&includes);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  std::__cxx11::string::~string((string *)&excludes);
  return false;
}

Assistant:

bool cmLoadCacheCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with wrong number of arguments.");
    return false;
  }

  if (args.size() >= 2 && args[1] == "READ_WITH_PREFIX") {
    return ReadWithPrefix(args, status);
  }

  if (status.GetMakefile().GetCMakeInstance()->GetWorkingMode() ==
      cmake::SCRIPT_MODE) {
    status.SetError(
      "Only load_cache(READ_WITH_PREFIX) may be used in script mode");
    return false;
  }

  // Cache entries to be excluded from the import list.
  // If this set is empty, all cache entries are brought in
  // and they can not be overridden.
  bool excludeFiles = false;
  std::set<std::string> excludes;

  for (std::string const& arg : args) {
    if (excludeFiles) {
      excludes.insert(arg);
    }
    if (arg == "EXCLUDE") {
      excludeFiles = true;
    }
    if (excludeFiles && (arg == "INCLUDE_INTERNALS")) {
      break;
    }
  }

  // Internal cache entries to be imported.
  // If this set is empty, no internal cache entries are
  // brought in.
  bool includeFiles = false;
  std::set<std::string> includes;

  for (std::string const& arg : args) {
    if (includeFiles) {
      includes.insert(arg);
    }
    if (arg == "INCLUDE_INTERNALS") {
      includeFiles = true;
    }
    if (includeFiles && (arg == "EXCLUDE")) {
      break;
    }
  }

  cmMakefile& mf = status.GetMakefile();

  // Loop over each build directory listed in the arguments.  Each
  // directory has a cache file.
  for (std::string const& arg : args) {
    if ((arg == "EXCLUDE") || (arg == "INCLUDE_INTERNALS")) {
      break;
    }
    mf.GetCMakeInstance()->LoadCache(arg, false, excludes, includes);
  }

  return true;
}